

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render_tree.hpp
# Opt level: O2

void __thiscall
duckdb::RenderTreeNode::RenderTreeNode
          (RenderTreeNode *this,string *name,
          InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *extra_text)

{
  ::std::__cxx11::string::string((string *)this,(string *)name);
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::InsertionOrderPreservingMap(&this->extra_text,extra_text);
  (this->child_positions).
  super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
  .
  super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->child_positions).
  super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
  .
  super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->child_positions).
  super_vector<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
  .
  super__Vector_base<duckdb::RenderTreeNode::Coordinate,_std::allocator<duckdb::RenderTreeNode::Coordinate>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

RenderTreeNode(const string &name, InsertionOrderPreservingMap<string> extra_text)
	    : name(name), extra_text(std::move(extra_text)) {
	}